

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O2

void Io_ReadBlifFree(Io_ReadBlif_t *p)

{
  Vec_Str_t *__ptr;
  
  Extra_FileReaderFree(p->pReader);
  Vec_PtrFree(p->vNewTokens);
  __ptr = p->vCubes;
  free(__ptr->pArray);
  free(__ptr);
  Vec_IntFree(p->vInArrs);
  Vec_IntFree(p->vOutReqs);
  Vec_IntFree(p->vInDrives);
  Vec_IntFree(p->vOutLoads);
  free(p);
  return;
}

Assistant:

void Io_ReadBlifFree( Io_ReadBlif_t * p )
{
    Extra_FileReaderFree( p->pReader );
    Vec_PtrFree( p->vNewTokens );
    Vec_StrFree( p->vCubes );
    Vec_IntFree( p->vInArrs );
    Vec_IntFree( p->vOutReqs );
    Vec_IntFree( p->vInDrives );
    Vec_IntFree( p->vOutLoads );
    ABC_FREE( p );
}